

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O2

int Bmcs_ManCollect_rec(Bmcs_Man_t *p,int iObj)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint Lit;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar2 = Vec_IntEntry(&p->pFrames->vCopies,iObj);
  if (iVar2 < 0) {
    pGVar5 = Gia_ManObj(p->pFrames,iObj);
    iVar2 = Vec_IntEntry(&p->vFr2Sat,iObj);
    if ((iVar2 < 1) && (uVar4 = (uint)*(undefined8 *)pGVar5, (~uVar4 & 0x9fffffff) != 0)) {
      if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                      ,0x1e5,"int Bmcs_ManCollect_rec(Bmcs_Man_t *, int)");
      }
      iVar2 = Bmcs_ManCollect_rec(p,iObj - (uVar4 & 0x1fffffff));
      iVar3 = Bmcs_ManCollect_rec(p,iObj - (*(uint *)&pGVar5->field_0x4 & 0x1fffffff));
      uVar4 = Abc_LitNotCond(iVar2,*(uint *)pGVar5 >> 0x1d & 1);
      Lit = Abc_LitNotCond(iVar3,(uint)((ulong)*(undefined8 *)pGVar5 >> 0x3d) & 1);
      pGVar1 = p->pClean;
      pGVar5 = Gia_ManAppendObj(pGVar1);
      iVar2 = Abc_Lit2Var(uVar4);
      if (pGVar1->nObjs <= iVar2) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      iVar2 = Abc_Lit2Var(Lit);
      if (pGVar1->nObjs <= iVar2) {
        __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      if (pGVar1->fGiaSimple == 0) {
        iVar2 = Abc_Lit2Var(uVar4);
        iVar3 = Abc_Lit2Var(Lit);
        if (iVar2 == iVar3) {
          __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x2ab,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
      }
      iVar2 = Gia_ObjId(pGVar1,pGVar5);
      iVar3 = Abc_Lit2Var(uVar4);
      uVar9 = (ulong)(iVar2 - iVar3 & 0x1fffffff);
      if (uVar4 < Lit) {
        *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffffe0000000 | uVar9;
        iVar2 = Abc_LitIsCompl(uVar4);
        *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffffdfffffff | (ulong)(uint)(iVar2 << 0x1d);
        iVar2 = Gia_ObjId(pGVar1,pGVar5);
        iVar3 = Abc_Lit2Var(Lit);
        *(ulong *)pGVar5 =
             *(ulong *)pGVar5 & 0xe0000000ffffffff | (ulong)(iVar2 - iVar3 & 0x1fffffff) << 0x20;
        uVar4 = Abc_LitIsCompl(Lit);
        uVar9 = *(ulong *)pGVar5 & 0xdfffffffffffffff | (ulong)uVar4 << 0x3d;
      }
      else {
        *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xe0000000ffffffff | uVar9 << 0x20;
        uVar4 = Abc_LitIsCompl(uVar4);
        *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xdfffffffffffffff | (ulong)uVar4 << 0x3d;
        iVar2 = Gia_ObjId(pGVar1,pGVar5);
        iVar3 = Abc_Lit2Var(Lit);
        *(ulong *)pGVar5 =
             *(ulong *)pGVar5 & 0xffffffffe0000000 | (ulong)(iVar2 - iVar3 & 0x1fffffff);
        iVar2 = Abc_LitIsCompl(Lit);
        uVar9 = *(ulong *)pGVar5 & 0xffffffffdfffffff | (ulong)(uint)(iVar2 << 0x1d);
      }
      *(ulong *)pGVar5 = uVar9;
      if (pGVar1->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(pGVar1,pGVar5 + -(uVar9 & 0x1fffffff),pGVar5);
        Gia_ObjAddFanout(pGVar1,pGVar5 + -((ulong)*(uint *)&pGVar5->field_0x4 & 0x1fffffff),pGVar5);
      }
      if (pGVar1->fSweeper != 0) {
        uVar6 = *(ulong *)pGVar5 & 0x1fffffff;
        uVar9 = *(ulong *)pGVar5 >> 0x20 & 0x1fffffff;
        uVar7 = 0x4000000000000000;
        uVar8 = 0x4000000000000000;
        if (((uint)*(ulong *)(pGVar5 + -uVar6) >> 0x1e & 1) == 0) {
          uVar8 = 0x40000000;
        }
        *(ulong *)(pGVar5 + -uVar6) = uVar8 | *(ulong *)(pGVar5 + -uVar6);
        uVar8 = *(ulong *)(pGVar5 + -uVar9);
        if (((uint)uVar8 >> 0x1e & 1) == 0) {
          uVar7 = 0x40000000;
        }
        *(ulong *)(pGVar5 + -uVar9) = uVar7 | uVar8;
        uVar9 = *(ulong *)pGVar5;
        *(ulong *)pGVar5 =
             uVar9 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar9 >> 0x3d) ^ (uint)(uVar8 >> 0x3f)) &
                    ((uint)((ulong)*(undefined8 *)(pGVar5 + -uVar6) >> 0x3f) ^
                    (uint)(uVar9 >> 0x1d) & 7)) << 0x3f;
      }
      if (pGVar1->fBuiltInSim != 0) {
        uVar9 = *(ulong *)pGVar5;
        *(ulong *)pGVar5 =
             uVar9 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar9 >> 0x3d) ^
                     (uint)((ulong)*(undefined8 *)(pGVar5 + -(uVar9 >> 0x20 & 0x1fffffff)) >> 0x3f))
                    & ((uint)((ulong)*(undefined8 *)(pGVar5 + -(uVar9 & 0x1fffffff)) >> 0x3f) ^
                      (uint)(uVar9 >> 0x1d) & 7)) << 0x3f;
        iVar2 = Gia_ObjId(pGVar1,pGVar5);
        Gia_ManBuiltInSimPerform(pGVar1,iVar2);
      }
      if (pGVar1->vSuppWords != (Vec_Wrd_t *)0x0) {
        Gia_ManQuantSetSuppAnd(pGVar1,pGVar5);
      }
      iVar2 = Gia_ObjId(pGVar1,pGVar5);
      iVar2 = iVar2 * 2;
    }
    else {
      iVar2 = Gia_ManAppendCi(p->pClean);
    }
    iVar3 = Abc_LitIsCompl(iVar2);
    if (iVar3 != 0) {
      __assert_fail("!Abc_LitIsCompl(iLitClean)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                    ,0x1e6,"int Bmcs_ManCollect_rec(Bmcs_Man_t *, int)");
    }
    pGVar1 = p->pClean;
    iVar3 = Abc_Lit2Var(iVar2);
    pGVar5 = Gia_ManObj(pGVar1,iVar3);
    pGVar5->Value = iObj;
    Vec_IntWriteEntry(&p->pFrames->vCopies,iObj,iVar2);
  }
  return iVar2;
}

Assistant:

int Bmcs_ManCollect_rec( Bmcs_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj; 
    int iSatVar, iLitClean = Gia_ObjCopyArray( p->pFrames, iObj );
    if ( iLitClean >= 0 )
        return iLitClean;
    pObj = Gia_ManObj( p->pFrames, iObj );
    iSatVar = Vec_IntEntry( &p->vFr2Sat, iObj );
    if ( iSatVar > 0 || Gia_ObjIsCi(pObj) )
        iLitClean = Gia_ManAppendCi( p->pClean );
    else if ( Gia_ObjIsAnd(pObj) )
    {
        int iLit0 = Bmcs_ManCollect_rec( p, Gia_ObjFaninId0(pObj, iObj) );
        int iLit1 = Bmcs_ManCollect_rec( p, Gia_ObjFaninId1(pObj, iObj) );
        iLit0 = Abc_LitNotCond( iLit0, Gia_ObjFaninC0(pObj) );
        iLit1 = Abc_LitNotCond( iLit1, Gia_ObjFaninC1(pObj) );
        iLitClean = Gia_ManAppendAnd( p->pClean, iLit0, iLit1 );
    }
    else assert( 0 );
    assert( !Abc_LitIsCompl(iLitClean) );
    Gia_ManObj( p->pClean, Abc_Lit2Var(iLitClean) )->Value = iObj;
    Gia_ObjSetCopyArray( p->pFrames, iObj, iLitClean );
    return iLitClean;
}